

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int omp_get_initial_device_(void)

{
  code *pcVar1;
  _func_int *fptr;
  int local_4;
  
  pcVar1 = (code *)dlsym(0xffffffffffffffff,"omp_get_initial_device");
  if (pcVar1 == (code *)0x0) {
    local_4 = -10;
  }
  else {
    local_4 = (*pcVar1)();
  }
  return local_4;
}

Assistant:

int FTN_STDCALL FTN_GET_INITIAL_DEVICE(void) {
#if KMP_MIC || KMP_OS_DARWIN || KMP_OS_WINDOWS || defined(KMP_STUB)
  return KMP_HOST_DEVICE;
#else
  int (*fptr)();
  if ((*(void **)(&fptr) = dlsym(RTLD_NEXT, "omp_get_initial_device"))) {
    return (*fptr)();
  } else { // liboffload & libomptarget don't exist
    return KMP_HOST_DEVICE;
  }
#endif
}